

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O1

int LZ4_decompress_safe_forceExtDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,void *dictStart,
              size_t dictSize)

{
  ushort *puVar1;
  byte *pbVar2;
  byte *pbVar3;
  byte bVar4;
  undefined8 uVar5;
  ushort uVar6;
  ushort uVar7;
  uint uVar8;
  int iVar9;
  long lVar10;
  byte *pbVar11;
  byte *pbVar12;
  ushort *puVar13;
  char cVar14;
  uint uVar15;
  long lVar16;
  ushort *puVar17;
  BYTE *d_1;
  byte *pbVar18;
  byte *pbVar19;
  BYTE *d;
  byte *pbVar20;
  byte *pbVar21;
  BYTE *s;
  ushort *puVar22;
  ushort *puVar23;
  ulong uVar24;
  ulong uVar25;
  ulong uStack_c0;
  byte *local_a0;
  int local_78;
  
  puVar13 = (ushort *)0xffffffffffffffff;
  if (source != (char *)0x0) {
    lVar10 = (long)dictStart + dictSize;
    if (dictStart == (void *)0x0) {
      lVar10 = 0;
    }
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        puVar13 = (ushort *)(ulong)-(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      puVar1 = (ushort *)(source + compressedSize);
      pbVar2 = (byte *)(dest + maxOutputSize);
      pbVar19 = (byte *)dest;
      puVar13 = (ushort *)source;
      if (maxOutputSize < 0x40) goto LAB_0010efcb;
      puVar17 = (ushort *)((long)puVar1 - 0xf);
      puVar22 = (ushort *)source;
LAB_0010e8c8:
      bVar4 = (byte)*puVar22;
      uVar15 = (uint)bVar4;
      puVar23 = (ushort *)((long)puVar22 + 1);
      uVar24 = (ulong)(uint)(bVar4 >> 4);
      puVar13 = puVar23;
      if (bVar4 >> 4 == 0xf) {
        uVar24 = 0xf;
        if (puVar23 < puVar17) {
          uVar8 = 0;
          do {
            uVar6 = *puVar13;
            puVar13 = (ushort *)((long)puVar13 + 1);
            uVar8 = uVar8 + (byte)uVar6;
          } while (puVar13 < puVar17 && (byte)uVar6 == 0xff);
          uVar24 = (ulong)uVar8 + 0xf;
        }
        pbVar18 = pbVar19 + uVar24;
        if (((puVar17 <= puVar23) || (CARRY8((ulong)pbVar19,uVar24))) ||
           (CARRY8((ulong)puVar13,uVar24))) {
          iVar9 = 5;
          pbVar18 = pbVar19;
        }
        else {
          local_a0 = pbVar18;
          if ((pbVar2 + -0x20 < pbVar18) || (puVar1 + -0x10 < (ushort *)((long)puVar13 + uVar24))) {
            iVar9 = 6;
            pbVar18 = pbVar19;
          }
          else {
            lVar16 = 0;
            do {
              uVar5 = *(undefined8 *)((byte *)((long)puVar13 + lVar16) + 8);
              pbVar11 = pbVar19 + lVar16;
              *(undefined8 *)pbVar11 = *(undefined8 *)((long)puVar13 + lVar16);
              *(undefined8 *)(pbVar11 + 8) = uVar5;
              pbVar3 = (byte *)((long)puVar13 + lVar16 + 0x10);
              uVar5 = *(undefined8 *)(pbVar3 + 8);
              *(undefined8 *)(pbVar11 + 0x10) = *(undefined8 *)pbVar3;
              *(undefined8 *)(pbVar11 + 0x18) = uVar5;
              lVar16 = lVar16 + 0x20;
            } while (pbVar11 + 0x20 < pbVar18);
            iVar9 = 0;
            puVar13 = (ushort *)((long)puVar13 + uVar24);
          }
        }
        if (iVar9 != 0) {
          if (iVar9 != 5) {
            pbVar19 = pbVar18;
            if (iVar9 == 6) goto LAB_0010edf0;
            goto LAB_0010f096;
          }
          goto LAB_0010f08e;
        }
      }
      else {
        pbVar18 = pbVar19 + uVar24;
        local_a0 = pbVar18;
        if ((ushort *)((long)puVar1 - 0x11U) < puVar23) goto LAB_0010edf0;
        uVar5 = *(undefined8 *)((long)puVar22 + 9);
        *(undefined8 *)pbVar19 = *(undefined8 *)puVar23;
        *(undefined8 *)(pbVar19 + 8) = uVar5;
        puVar13 = (ushort *)(uVar24 + (long)puVar23);
      }
      uVar6 = *puVar13;
      uVar25 = (ulong)uVar6;
      puVar13 = puVar13 + 1;
      pbVar11 = pbVar18 + -uVar25;
      uVar24 = (ulong)(bVar4 & 0xf);
      if (uVar24 == 0xf) {
        if ((dictSize < 0x10000) && (pbVar11 + dictSize < dest)) {
          iVar9 = 5;
          uStack_c0 = 0xf;
        }
        else {
          uVar15 = 0;
          do {
            uVar7 = *puVar13;
            puVar13 = (ushort *)((long)puVar13 + 1);
            uVar15 = uVar15 + (byte)uVar7;
          } while ((byte)uVar7 == 0xff && puVar13 < puVar1 + -2);
          uVar24 = (ulong)uVar15;
          uStack_c0 = uVar24 + 0xf;
          if ((puVar1 + -2 <= puVar13) || (CARRY8((ulong)pbVar18,uStack_c0))) {
            iVar9 = 5;
          }
          else {
            uStack_c0 = uVar24 + 0x13;
            iVar9 = 7;
            if (pbVar18 + uVar24 + 0x13 < pbVar2 + -0x40) {
              iVar9 = 0;
            }
          }
        }
        if (iVar9 != 0) {
          if (iVar9 != 5) {
            if (iVar9 == 7) goto LAB_0010ee99;
            goto LAB_0010f096;
          }
          goto LAB_0010f08e;
        }
      }
      else {
        uStack_c0 = uVar24 + 4;
        if (pbVar2 + -0x40 <= pbVar18 + uVar24 + 4) goto LAB_0010ee99;
        if ((dest <= pbVar11) && (7 < uVar6)) {
          *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
          *(undefined8 *)(pbVar18 + 8) = *(undefined8 *)(pbVar11 + 8);
          *(undefined2 *)(pbVar18 + 0x10) = *(undefined2 *)(pbVar11 + 0x10);
          pbVar19 = pbVar18 + uVar24 + 4;
          puVar22 = puVar13;
          goto LAB_0010e8c8;
        }
      }
      if ((dictSize < 0x10000) && (pbVar11 + dictSize < dest)) goto LAB_0010f08e;
      pbVar3 = pbVar18 + uStack_c0;
      pbVar19 = pbVar3;
      puVar22 = puVar13;
      if (dest <= pbVar11) {
        local_a0 = pbVar3;
        if (0xf < uVar6) {
          do {
            uVar5 = *(undefined8 *)(pbVar18 + -uVar25 + 8);
            *(undefined8 *)pbVar18 = *(undefined8 *)(pbVar18 + -uVar25);
            *(undefined8 *)(pbVar18 + 8) = uVar5;
            uVar5 = *(undefined8 *)(pbVar18 + -uVar25 + 0x10 + 8);
            *(undefined8 *)(pbVar18 + 0x10) = *(undefined8 *)(pbVar18 + -uVar25 + 0x10);
            *(undefined8 *)(pbVar18 + 0x18) = uVar5;
            pbVar18 = pbVar18 + 0x20;
          } while (pbVar18 < pbVar3);
          goto LAB_0010e8c8;
        }
        if (uVar25 == 4) {
          iVar9 = *(int *)pbVar11;
        }
        else if (uVar6 == 2) {
          iVar9 = CONCAT22(*(undefined2 *)pbVar11,*(undefined2 *)pbVar11);
        }
        else {
          if (uVar6 != 1) {
            if (uVar6 < 8) {
              pbVar18[0] = 0;
              pbVar18[1] = 0;
              pbVar18[2] = 0;
              pbVar18[3] = 0;
              *pbVar18 = *pbVar11;
              pbVar18[1] = pbVar11[1];
              pbVar18[2] = pbVar11[2];
              pbVar18[3] = pbVar11[3];
              uVar15 = inc32table[uVar6];
              *(undefined4 *)(pbVar18 + 4) = *(undefined4 *)(pbVar11 + uVar15);
              pbVar11 = pbVar11 + ((ulong)uVar15 - (long)dec64table[uVar6]);
            }
            else {
              *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
              pbVar11 = pbVar11 + 8;
            }
            pbVar18 = pbVar18 + 8;
            do {
              *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
              pbVar18 = pbVar18 + 8;
              pbVar11 = pbVar11 + 8;
            } while (pbVar18 < pbVar3);
            goto LAB_0010e8c8;
          }
          iVar9 = (uint)*pbVar11 * 0x1010101;
        }
        *(int *)pbVar18 = iVar9;
        *(int *)(pbVar18 + 4) = iVar9;
        if (8 < uStack_c0) {
          pbVar18 = pbVar18 + 8;
          do {
            *(int *)pbVar18 = iVar9;
            *(int *)(pbVar18 + 4) = iVar9;
            pbVar18 = pbVar18 + 8;
          } while (pbVar18 < pbVar3);
        }
        goto LAB_0010e8c8;
      }
      if (pbVar2 + -5 < pbVar3) goto LAB_0010f08e;
      uVar25 = (long)dest - (long)pbVar11;
      uVar24 = uStack_c0 - uVar25;
      if (uStack_c0 < uVar25 || uVar24 == 0) {
        memmove(pbVar18,(void *)(lVar10 - uVar25),uStack_c0);
      }
      else {
        memcpy(pbVar18,(void *)(lVar10 - uVar25),uVar25);
        pbVar19 = pbVar18 + uVar25;
        if ((ulong)((long)pbVar19 - (long)dest) < uVar24) {
          pbVar18 = (byte *)dest;
          if ((long)uVar25 < (long)uStack_c0) {
            do {
              *pbVar19 = *pbVar18;
              pbVar19 = pbVar19 + 1;
              pbVar18 = pbVar18 + 1;
            } while (pbVar19 < pbVar3);
          }
        }
        else {
          memcpy(pbVar19,dest,uVar24);
          pbVar19 = pbVar3;
        }
      }
      goto LAB_0010e8c8;
    }
  }
  goto LAB_0010f096;
LAB_0010ee99:
  if ((dictSize < 0x10000) && (pbVar11 + dictSize < dest)) goto LAB_0010f08e;
  pbVar3 = pbVar18 + uStack_c0;
  pbVar19 = pbVar3;
  if (pbVar11 < dest) {
    if (pbVar2 + -5 < pbVar3) goto LAB_0010f08e;
    uVar25 = (long)dest - (long)pbVar11;
    uVar24 = uStack_c0 - uVar25;
    if (uStack_c0 < uVar25 || uVar24 == 0) {
      memmove(pbVar18,(void *)(lVar10 - uVar25),uStack_c0);
    }
    else {
      memcpy(pbVar18,(void *)(lVar10 - uVar25),uVar25);
      pbVar19 = pbVar18 + uVar25;
      if ((ulong)((long)pbVar19 - (long)dest) < uVar24) {
        pbVar18 = (byte *)dest;
        if ((long)uVar25 < (long)uStack_c0) {
          do {
            *pbVar19 = *pbVar18;
            pbVar19 = pbVar19 + 1;
            pbVar18 = pbVar18 + 1;
          } while (pbVar19 < pbVar3);
        }
      }
      else {
        memcpy(pbVar19,dest,uVar24);
        pbVar19 = pbVar3;
      }
    }
  }
  else {
    if ((uint)uVar25 < 8) {
      pbVar18[0] = 0;
      pbVar18[1] = 0;
      pbVar18[2] = 0;
      pbVar18[3] = 0;
      *pbVar18 = *pbVar11;
      pbVar18[1] = pbVar11[1];
      pbVar18[2] = pbVar11[2];
      pbVar18[3] = pbVar11[3];
      uVar24 = (ulong)((uint)uVar25 << 2);
      uVar25 = (ulong)*(uint *)((long)inc32table + uVar24);
      *(undefined4 *)(pbVar18 + 4) = *(undefined4 *)(pbVar11 + uVar25);
      pbVar11 = pbVar11 + (uVar25 - (long)*(int *)((long)dec64table + uVar24));
    }
    else {
      *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
      pbVar11 = pbVar11 + 8;
    }
    pbVar12 = pbVar18 + 8;
    if (pbVar2 + -0xc < pbVar3) {
      iVar9 = 5;
      if (pbVar3 <= pbVar2 + -5) {
        pbVar18 = pbVar2 + -7;
        pbVar20 = pbVar11;
        pbVar21 = pbVar12;
        if (pbVar12 < pbVar18) {
          do {
            *(undefined8 *)pbVar21 = *(undefined8 *)pbVar20;
            pbVar21 = pbVar21 + 8;
            pbVar20 = pbVar20 + 8;
          } while (pbVar21 < pbVar18);
          pbVar11 = pbVar11 + ((long)pbVar18 - (long)pbVar12);
          pbVar12 = pbVar18;
        }
        iVar9 = 0;
        for (; pbVar12 < pbVar3; pbVar12 = pbVar12 + 1) {
          bVar4 = *pbVar11;
          pbVar11 = pbVar11 + 1;
          *pbVar12 = bVar4;
        }
      }
      if (iVar9 != 0) {
        if (iVar9 != 5) goto LAB_0010f096;
        goto LAB_0010f08e;
      }
    }
    else {
      *(undefined8 *)pbVar12 = *(undefined8 *)pbVar11;
      if (0x10 < uStack_c0) {
        pbVar18 = pbVar18 + 0x10;
        do {
          pbVar11 = pbVar11 + 8;
          *(undefined8 *)pbVar18 = *(undefined8 *)pbVar11;
          pbVar18 = pbVar18 + 8;
        } while (pbVar18 < pbVar3);
      }
    }
  }
LAB_0010efcb:
  bVar4 = (byte)*puVar13;
  puVar17 = (ushort *)((long)puVar13 + 1);
  while( true ) {
    uVar15 = (uint)bVar4;
    if (bVar4 >> 4 == 0xf) break;
    uVar24 = (ulong)(uint)(bVar4 >> 4);
    if ((source + (long)compressedSize + -0x10 <= puVar17) ||
       (dest + (long)maxOutputSize + -0x20 < pbVar19)) goto LAB_0010edec;
    uVar5 = *(undefined8 *)(puVar17 + 4);
    *(undefined8 *)pbVar19 = *(undefined8 *)puVar17;
    *(undefined8 *)(pbVar19 + 8) = uVar5;
    local_a0 = pbVar19 + uVar24;
    uStack_c0 = (ulong)(uVar15 & 0xf);
    puVar22 = (ushort *)((long)puVar17 + uVar24);
    uVar25 = (ulong)*puVar22;
    pbVar11 = local_a0 + -uVar25;
    if ((((uVar15 & 0xf) == 0xf) || (*puVar22 < 8)) || (pbVar11 < dest)) goto LAB_0010ee3c;
    *(undefined8 *)local_a0 = *(undefined8 *)pbVar11;
    *(undefined8 *)(local_a0 + 8) = *(undefined8 *)(pbVar11 + 8);
    *(undefined2 *)(local_a0 + 0x10) = *(undefined2 *)(pbVar11 + 0x10);
    pbVar19 = local_a0 + uStack_c0 + 4;
    bVar4 = *(byte *)((long)puVar17 + uVar24 + 2);
    puVar17 = (ushort *)((long)puVar17 + uVar24 + 3);
  }
  puVar22 = (ushort *)((long)puVar1 - 0xf);
  uVar24 = 0xf;
  puVar13 = puVar17;
  if (puVar17 < puVar22) {
    uVar8 = 0;
    do {
      uVar6 = *puVar13;
      puVar13 = (ushort *)((long)puVar13 + 1);
      uVar8 = uVar8 + (byte)uVar6;
    } while (puVar13 < puVar22 && (byte)uVar6 == 0xff);
    uVar24 = (ulong)uVar8 + 0xf;
  }
  if (((puVar22 <= puVar17) || (CARRY8((ulong)pbVar19,uVar24))) ||
     (puVar17 = puVar13, CARRY8((ulong)puVar13,uVar24))) goto LAB_0010f08e;
LAB_0010edec:
  local_a0 = pbVar19 + uVar24;
  puVar13 = puVar17;
LAB_0010edf0:
  puVar22 = (ushort *)((long)puVar13 + uVar24);
  if ((pbVar2 + -0xc < local_a0) || (puVar1 + -4 < puVar22)) {
    if ((puVar22 != puVar1) || (pbVar2 < local_a0)) goto LAB_0010f08e;
    memmove(pbVar19,puVar13,uVar24);
    puVar13 = (ushort *)(ulong)(uint)(((int)pbVar19 + (int)uVar24) - (int)dest);
    goto LAB_0010f096;
  }
  do {
    *(undefined8 *)pbVar19 = *(undefined8 *)puVar13;
    pbVar19 = pbVar19 + 8;
    puVar13 = puVar13 + 4;
  } while (pbVar19 < local_a0);
  uVar25 = (ulong)*puVar22;
  pbVar11 = local_a0 + -uVar25;
  uStack_c0 = (ulong)(uVar15 & 0xf);
LAB_0010ee3c:
  puVar13 = puVar22 + 1;
  if ((int)uStack_c0 == 0xf) {
    uVar15 = 0;
    do {
      uVar6 = *puVar13;
      puVar13 = (ushort *)((long)puVar13 + 1);
      uVar15 = uVar15 + (byte)uVar6;
    } while (puVar13 < puVar1 + -2 && (byte)uVar6 == 0xff);
    uStack_c0 = (ulong)uVar15 + 0xf;
    cVar14 = '\x05';
    if (puVar13 < puVar1 + -2) {
      cVar14 = CARRY8((ulong)local_a0,uStack_c0) * '\x05';
    }
    if (cVar14 != '\0') goto LAB_0010efea;
  }
  uStack_c0 = uStack_c0 + 4;
  pbVar18 = local_a0;
  goto LAB_0010ee99;
LAB_0010efea:
  if (cVar14 == '\x05') {
LAB_0010f08e:
    local_78 = (int)source;
    puVar13 = (ushort *)(ulong)(~(uint)puVar13 + local_78);
  }
LAB_0010f096:
  return (int)puVar13;
}

Assistant:

LZ4_FORCE_O2
int LZ4_decompress_safe_forceExtDict(const char* source, char* dest,
                                     int compressedSize, int maxOutputSize,
                                     const void* dictStart, size_t dictSize)
{
    return LZ4_decompress_generic(source, dest, compressedSize, maxOutputSize,
                                  endOnInputSize, decode_full_block, usingExtDict,
                                  (BYTE*)dest, (const BYTE*)dictStart, dictSize);
}